

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::fixRedefinedSchema
          (TraverseSchema *this,DOMElement *elem,SchemaInfo *redefinedSchemaInfo,
          XMLCh *redefineChildComponentName,XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  XMLBuffer *this_00;
  XMLCh XVar1;
  XMLCh XVar2;
  SchemaInfo *redefinedSchemaInfo_00;
  XMLStringPool *pXVar3;
  XMLSize_t XVar4;
  MemoryManager *pMVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  DOMNode *parent;
  undefined4 extraout_var;
  DOMNode *node;
  undefined4 extraout_var_00;
  XMLCh *pXVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar10;
  undefined4 extraout_var_03;
  char cVar11;
  XMLCh *pXVar12;
  XMLCh *pXVar13;
  bool bVar14;
  
  parent = &XUtil::getFirstChildElement(&redefinedSchemaInfo->fSchemaRootElement->super_DOMNode)->
            super_DOMNode;
  this->fSchemaInfo = redefinedSchemaInfo;
  if (parent != (DOMNode *)0x0) {
    this_00 = &this->fBuffer;
    bVar6 = false;
    do {
      iVar7 = (*parent->_vptr_DOMNode[0x18])(parent);
      pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar7);
      if (pXVar9 == redefineChildComponentName) {
LAB_0033ea99:
        pXVar9 = getElementAttValue(this,(DOMElement *)parent,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                    NCName);
        if (pXVar9 != redefineChildTypeName) {
          pXVar12 = redefineChildTypeName;
          if ((redefineChildTypeName != (XMLCh *)0x0) && (pXVar13 = pXVar9, pXVar9 != (XMLCh *)0x0))
          {
            do {
              XVar1 = *pXVar13;
              if (XVar1 == L'\0') goto LAB_0033f01c;
              pXVar13 = pXVar13 + 1;
              XVar2 = *pXVar12;
              pXVar12 = pXVar12 + 1;
            } while (XVar1 == XVar2);
            cVar11 = '\x04';
            goto LAB_0033f0bb;
          }
          if (pXVar9 == (XMLCh *)0x0) {
            if (redefineChildTypeName == (XMLCh *)0x0) goto LAB_0033f030;
LAB_0033f01c:
            bVar14 = *pXVar12 == L'\0';
          }
          else {
            bVar14 = *pXVar9 == L'\0';
            if ((redefineChildTypeName != (XMLCh *)0x0) && (*pXVar9 == L'\0')) goto LAB_0033f01c;
          }
          cVar11 = '\x04';
          if (!bVar14) goto LAB_0033f0bb;
        }
LAB_0033f030:
        this_00->fIndex = 0;
        if ((pXVar9 != (XMLCh *)0x0) && (*pXVar9 != L'\0')) {
          XMLBuffer::append(this_00,pXVar9);
        }
        iVar7 = redefineNameCounter;
        if (0 < redefineNameCounter) {
          do {
            XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        (*parent->_vptr_DOMNode[0x2c])(parent,SchemaSymbols::fgATT_NAME);
        bVar6 = true;
        cVar11 = '\x02';
      }
      else {
        pXVar12 = redefineChildComponentName;
        if ((redefineChildComponentName == (XMLCh *)0x0) ||
           (pXVar13 = pXVar9, pXVar9 == (XMLCh *)0x0)) {
          if (pXVar9 == (XMLCh *)0x0) {
            if (redefineChildComponentName == (XMLCh *)0x0) goto LAB_0033ea99;
LAB_0033ea8e:
            bVar14 = *pXVar12 == L'\0';
          }
          else {
            bVar14 = *pXVar9 == L'\0';
            if ((redefineChildComponentName != (XMLCh *)0x0) && (*pXVar9 == L'\0'))
            goto LAB_0033ea8e;
          }
          if (bVar14) goto LAB_0033ea99;
        }
        else {
          do {
            XVar1 = *pXVar13;
            if (XVar1 == L'\0') goto LAB_0033ea8e;
            pXVar13 = pXVar13 + 1;
            XVar2 = *pXVar12;
            pXVar12 = pXVar12 + 1;
          } while (XVar1 == XVar2);
        }
        if (pXVar9 == L"redefine") {
LAB_0033eb55:
          node = &XUtil::getFirstChildElement(parent)->super_DOMNode;
          cVar11 = '\x05';
          if (node != (DOMNode *)0x0) {
            do {
              iVar7 = (*node->_vptr_DOMNode[0x18])(node);
              pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
              if (pXVar9 == redefineChildComponentName) {
LAB_0033ebdf:
                pXVar9 = getElementAttValue(this,(DOMElement *)node,
                                            (XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
                if (pXVar9 != redefineChildTypeName) {
                  pXVar12 = redefineChildTypeName;
                  if ((redefineChildTypeName != (XMLCh *)0x0) &&
                     (pXVar13 = pXVar9, pXVar9 != (XMLCh *)0x0)) {
                    do {
                      XVar1 = *pXVar13;
                      if (XVar1 == L'\0') goto LAB_0033ec5f;
                      pXVar13 = pXVar13 + 1;
                      XVar2 = *pXVar12;
                      pXVar12 = pXVar12 + 1;
                    } while (XVar1 == XVar2);
                    cVar11 = '\a';
                    goto LAB_0033efe2;
                  }
                  if (pXVar9 == (XMLCh *)0x0) {
                    if (redefineChildTypeName == (XMLCh *)0x0) goto LAB_0033ec74;
LAB_0033ec5f:
                    bVar14 = *pXVar12 == L'\0';
                  }
                  else {
                    bVar14 = *pXVar9 == L'\0';
                    if ((redefineChildTypeName != (XMLCh *)0x0) && (*pXVar9 == L'\0'))
                    goto LAB_0033ec5f;
                  }
                  cVar11 = '\a';
                  if (!bVar14) goto LAB_0033efe2;
                }
LAB_0033ec74:
                bVar14 = openRedefinedSchema(this,(DOMElement *)parent);
                if (bVar14) {
                  redefinedSchemaInfo_00 = this->fSchemaInfo;
                  bVar6 = validateRedefineNameChange
                                    (this,(DOMElement *)node,redefineChildComponentName,
                                     redefineChildTypeName,redefineNameCounter + 1,
                                     redefinedSchemaInfo);
                  if (bVar6) {
                    fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo_00,
                                       redefineChildComponentName,redefineChildTypeName,
                                       redefineNameCounter + 1);
                    (this->fBuffer).fIndex = 0;
                    if ((pXVar9 != (XMLCh *)0x0) && (*pXVar9 != L'\0')) {
                      XMLBuffer::append(this_00,pXVar9);
                    }
                    iVar7 = redefineNameCounter;
                    if (0 < redefineNameCounter) {
                      do {
                        XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
                        iVar7 = iVar7 + -1;
                      } while (iVar7 != 0);
                    }
                    pXVar3 = this->fStringPool;
                    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
                    uVar8 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
                    iVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])
                                      (pXVar3,(ulong)uVar8);
                    pXVar9 = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
                    (*node->_vptr_DOMNode[0x2c])(node,SchemaSymbols::fgATT_NAME,pXVar9);
                    pXVar12 = this->fTargetNSURIString;
                    (this->fBuffer).fIndex = 0;
                    if ((pXVar12 != (XMLCh *)0x0) && (*pXVar12 != L'\0')) {
                      XMLBuffer::append(this_00,pXVar12);
                    }
                    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
                      XMLBuffer::ensureCapacity(this_00,1);
                    }
                    XVar4 = (this->fBuffer).fIndex;
                    (this->fBuffer).fIndex = XVar4 + 1;
                    (this->fBuffer).fBuffer[XVar4] = L',';
                  }
                  else {
                    fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo_00,
                                       redefineChildComponentName,redefineChildTypeName,
                                       redefineNameCounter);
                    if (redefinedSchemaInfo->fFailedRedefineList ==
                        (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
                      pVVar10 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
                                XMemory::operator_new(0x28,redefinedSchemaInfo->fMemoryManager);
                      pMVar5 = redefinedSchemaInfo->fMemoryManager;
                      pVVar10->fCallDestructor = false;
                      pVVar10->fCurCount = 0;
                      pVVar10->fMaxCount = 4;
                      pVVar10->fElemList = (DOMElement **)0x0;
                      pVVar10->fMemoryManager = pMVar5;
                      iVar7 = (*pMVar5->_vptr_MemoryManager[3])();
                      pVVar10->fElemList = (DOMElement **)CONCAT44(extraout_var_03,iVar7);
                      memset((DOMElement **)CONCAT44(extraout_var_03,iVar7),0,
                             pVVar10->fMaxCount << 3);
                      redefinedSchemaInfo->fFailedRedefineList = pVVar10;
                    }
                    pVVar10 = redefinedSchemaInfo->fFailedRedefineList;
                    ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(pVVar10,1);
                    XVar4 = pVVar10->fCurCount;
                    pVVar10->fCurCount = XVar4 + 1;
                    pVVar10->fElemList[XVar4] = (DOMElement *)node;
                    pXVar12 = this->fTargetNSURIString;
                    (this->fBuffer).fIndex = 0;
                    if ((pXVar12 != (XMLCh *)0x0) && (*pXVar12 != L'\0')) {
                      XMLBuffer::append(this_00,pXVar12);
                    }
                    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
                      XMLBuffer::ensureCapacity(this_00,1);
                    }
                    XVar4 = (this->fBuffer).fIndex;
                    (this->fBuffer).fIndex = XVar4 + 1;
                    (this->fBuffer).fBuffer[XVar4] = L',';
                  }
                  XMLBuffer::append(this_00,pXVar9);
                  pXVar3 = this->fStringPool;
                  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
                  iVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
                  bVar14 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                                     (this->fRedefineComponents,redefineChildComponentName,iVar7);
                  bVar6 = true;
                  cVar11 = '\x05';
                  if (!bVar14) {
                    RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                              (this->fRedefineComponents,redefineChildComponentName,iVar7,
                               (char16_t *)0x0);
                  }
                }
                else {
                  if (redefinedSchemaInfo->fFailedRedefineList ==
                      (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
                    pVVar10 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
                              XMemory::operator_new(0x28,redefinedSchemaInfo->fMemoryManager);
                    pMVar5 = redefinedSchemaInfo->fMemoryManager;
                    pVVar10->fCallDestructor = false;
                    pVVar10->fCurCount = 0;
                    pVVar10->fMaxCount = 4;
                    pVVar10->fElemList = (DOMElement **)0x0;
                    pVVar10->fMemoryManager = pMVar5;
                    iVar7 = (*pMVar5->_vptr_MemoryManager[3])();
                    pVVar10->fElemList = (DOMElement **)CONCAT44(extraout_var_02,iVar7);
                    memset((DOMElement **)CONCAT44(extraout_var_02,iVar7),0,pVVar10->fMaxCount << 3)
                    ;
                    redefinedSchemaInfo->fFailedRedefineList = pVVar10;
                  }
                  pVVar10 = redefinedSchemaInfo->fFailedRedefineList;
                  ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(pVVar10,1);
                  XVar4 = pVVar10->fCurCount;
                  pVVar10->fCurCount = XVar4 + 1;
                  pVVar10->fElemList[XVar4] = (DOMElement *)parent;
                  cVar11 = '\x01';
                }
              }
              else {
                pXVar12 = redefineChildComponentName;
                if ((redefineChildComponentName == (XMLCh *)0x0) || (pXVar9 == (XMLCh *)0x0)) {
                  if (pXVar9 == (XMLCh *)0x0) {
                    if (redefineChildComponentName == (XMLCh *)0x0) goto LAB_0033ebdf;
LAB_0033ebd4:
                    bVar14 = *pXVar12 == L'\0';
                  }
                  else {
                    bVar14 = *pXVar9 == L'\0';
                    if ((redefineChildComponentName != (XMLCh *)0x0) && (*pXVar9 == L'\0'))
                    goto LAB_0033ebd4;
                  }
                  if (bVar14) goto LAB_0033ebdf;
                }
                else {
                  do {
                    XVar1 = *pXVar9;
                    if (XVar1 == L'\0') goto LAB_0033ebd4;
                    pXVar9 = pXVar9 + 1;
                    XVar2 = *pXVar12;
                    pXVar12 = pXVar12 + 1;
                  } while (XVar1 == XVar2);
                }
                cVar11 = '\0';
              }
LAB_0033efe2:
              if ((cVar11 != '\a') && (cVar11 != '\0')) goto LAB_0033f0e2;
              node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
            } while (node != (DOMNode *)0x0);
            cVar11 = '\x05';
          }
LAB_0033f0e2:
          if (cVar11 == '\x05') {
            cVar11 = bVar6 * '\x02';
          }
        }
        else {
          pXVar12 = L"redefine";
          if (pXVar9 == (XMLCh *)0x0) {
LAB_0033eb48:
            if (*pXVar12 == L'\0') goto LAB_0033eb55;
          }
          else {
            pXVar12 = L"redefine";
            do {
              XVar1 = *pXVar9;
              if (XVar1 == L'\0') goto LAB_0033eb48;
              pXVar9 = pXVar9 + 1;
              XVar2 = *pXVar12;
              pXVar12 = pXVar12 + 1;
            } while (XVar1 == XVar2);
          }
          cVar11 = '\0';
        }
      }
LAB_0033f0bb:
      if ((cVar11 != '\0') && (cVar11 != '\x04')) {
        if (cVar11 != '\x02') {
          return;
        }
        break;
      }
      parent = &XUtil::getNextSiblingElement(parent)->super_DOMNode;
    } while (parent != (DOMNode *)0x0);
    if (bVar6) {
      return;
    }
  }
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x7d,redefineChildTypeName
                    ,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  return;
}

Assistant:

void TraverseSchema::fixRedefinedSchema(const DOMElement* const elem,
                                        SchemaInfo* const redefinedSchemaInfo,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {

    bool foundIt = false;
    DOMElement* child = XUtil::getFirstChildElement(redefinedSchemaInfo->getRoot());

    restoreSchemaInfo(redefinedSchemaInfo);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, redefineChildComponentName)) {

            const XMLCh* infoItemName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

            if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                continue;
            }
            else { // found it!

                // now we have to do the renaming...
                foundIt = true;
                getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                child->setAttribute(SchemaSymbols::fgATT_NAME, fBuffer.getRawBuffer());
                break;
            }
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) { // need to search the redefine decl...

            for (DOMElement* redefChild = XUtil::getFirstChildElement(child);
                 redefChild != 0;
                 redefChild = XUtil::getNextSiblingElement(redefChild)) {

                const XMLCh* redefName = redefChild->getLocalName();

                if (XMLString::equals(redefName, redefineChildComponentName)) {

                    const XMLCh* infoItemName = getElementAttValue(redefChild, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

                    if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                        continue;
                    }
                    else { // found it!

                        if (!openRedefinedSchema(child)) {

                            redefinedSchemaInfo->addFailedRedefine(child);
                            return;
                        }

                        foundIt = true;

                        SchemaInfo* reRedefinedSchemaInfo = fSchemaInfo;

                        if (validateRedefineNameChange(redefChild, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1, redefinedSchemaInfo)) {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1);

                            // now we have to do the renaming...
                            getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                            const XMLCh* newInfoItemName = fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
                            redefChild->setAttribute(SchemaSymbols::fgATT_NAME, newInfoItemName);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(newInfoItemName);
                        }
                        else {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
                            redefinedSchemaInfo->addFailedRedefine(redefChild);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(infoItemName);
                        }

                        unsigned int infoItemNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());

                        if (!fRedefineComponents->containsKey(redefineChildComponentName, infoItemNameId)) {
                            fRedefineComponents->put((void*) redefineChildComponentName, infoItemNameId, 0);
                        }

                        break;
                    }
                }
            } //for

            if (foundIt) {
                break;
            }
        }
    } //for

    if(!foundIt) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_DeclarationNotFound, redefineChildTypeName);
    }
}